

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall
cmTarget::AddLinkLibrary(cmTarget *this,cmMakefile *mf,string *lib,cmTargetLinkLibraryType llt)

{
  int iVar1;
  bool bVar2;
  __type _Var3;
  PolicyStatus PVar4;
  cmTarget *this_00;
  size_type sVar5;
  cmValue cVar6;
  allocator<char> local_cd;
  cmTargetLinkLibraryType llt_local;
  string libName;
  string targetEntry;
  string local_88;
  _Storage<cmListFileBacktrace,_false> local_68;
  undefined1 local_58;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  
  llt_local = llt;
  this_00 = cmMakefile::FindTargetToUse(mf,lib,false);
  if ((this_00 == (cmTarget *)0x0) ||
     (bVar2 = IsImported(this_00), llt == GENERAL_LibraryType || bVar2)) {
    std::__cxx11::string::string((string *)&libName,(string *)lib);
  }
  else {
    std::operator+(&targetEntry,"$<TARGET_NAME:",lib);
    std::operator+(&libName,&targetEntry,">");
    std::__cxx11::string::~string((string *)&targetEntry);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&targetEntry,"LINK_LIBRARIES",&local_cd);
  GetDebugGeneratorExpressions(&local_88,this,&libName,llt);
  cmMakefile::GetBacktrace((cmMakefile *)&stack0xffffffffffffffb8);
  local_68._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = local_48;
  local_68._M_value.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)_Stack_40._M_pi;
  local_48 = (element_type *)0x0;
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_58 = 1;
  AppendProperty(this,&targetEntry,&local_88,(optional<cmListFileBacktrace> *)&local_68._M_value,
                 false);
  std::_Optional_payload_base<cmListFileBacktrace>::_M_reset
            ((_Optional_payload_base<cmListFileBacktrace> *)&local_68._M_value);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffffc0);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&targetEntry);
  std::__cxx11::string::~string((string *)&libName);
  sVar5 = cmGeneratorExpression::Find(lib);
  if (((sVar5 == 0xffffffffffffffff) &&
      (((this_00 == (cmTarget *)0x0 ||
        ((iVar1 = ((this_00->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType,
         iVar1 != 4 && (iVar1 != 7)))) &&
       (_Var3 = std::operator==(&((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 Name,lib), !_Var3)))) &&
     (std::
      vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
      ::emplace_back<std::__cxx11::string_const&,cmTargetLinkLibraryType&>
                ((vector<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>,std::allocator<std::pair<std::__cxx11::string,cmTargetLinkLibraryType>>>
                  *)&((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                     OriginalLinkLibraries,lib,&llt_local),
     ((this->impl)._M_t.
      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
      super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType - 1 < 3)) {
    PVar4 = GetPolicyStatusCMP0073(this);
    if ((PVar4 != OLD) && (PVar4 = GetPolicyStatusCMP0073(this), PVar4 != WARN)) {
      return;
    }
    cmStrCat<std::__cxx11::string&,char_const(&)[13]>
              (&targetEntry,
               &((this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Name,
               (char (*) [13])"_LIB_DEPENDS");
    libName._M_dataplus._M_p = (pointer)&libName.field_2;
    libName._M_string_length = 0;
    libName.field_2._M_local_buf[0] = '\0';
    cVar6 = cmMakefile::GetDefinition(mf,&targetEntry);
    if (cVar6.Value != (string *)0x0) {
      std::__cxx11::string::append((string *)&libName);
    }
    if (llt_local < (OPTIMIZED_LibraryType|DEBUG_LibraryType)) {
      std::__cxx11::string::append((char *)&libName);
    }
    std::__cxx11::string::append((char *)&libName);
    std::__cxx11::string::append((string *)&libName);
    std::__cxx11::string::append((char *)&libName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"Dependencies for the target",
               (allocator<char> *)&local_68._M_value);
    cmMakefile::AddCacheDefinition(mf,&targetEntry,&libName,&local_88,STATIC,false);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&libName);
    std::__cxx11::string::~string((string *)&targetEntry);
  }
  return;
}

Assistant:

void cmTarget::AddLinkLibrary(cmMakefile& mf, std::string const& lib,
                              cmTargetLinkLibraryType llt)
{
  cmTarget* tgt = mf.FindTargetToUse(lib);
  {
    const bool isNonImportedTarget = tgt && !tgt->IsImported();

    const std::string libName =
      (isNonImportedTarget && llt != GENERAL_LibraryType)
      ? targetNameGenex(lib)
      : lib;
    this->AppendProperty("LINK_LIBRARIES",
                         this->GetDebugGeneratorExpressions(libName, llt),
                         mf.GetBacktrace());
  }

  if (cmGeneratorExpression::Find(lib) != std::string::npos ||
      (tgt &&
       (tgt->GetType() == cmStateEnums::INTERFACE_LIBRARY ||
        tgt->GetType() == cmStateEnums::OBJECT_LIBRARY)) ||
      (this->impl->Name == lib)) {
    return;
  }

  this->impl->OriginalLinkLibraries.emplace_back(lib, llt);

  // Add the explicit dependency information for libraries. This is
  // simply a set of libraries separated by ";". There should always
  // be a trailing ";". These library names are not canonical, in that
  // they may be "-framework x", "-ly", "/path/libz.a", etc.
  // We shouldn't remove duplicates here because external libraries
  // may be purposefully duplicated to handle recursive dependencies,
  // and we removing one instance will break the link line. Duplicates
  // will be appropriately eliminated at emit time.
  if (this->impl->TargetType >= cmStateEnums::STATIC_LIBRARY &&
      this->impl->TargetType <= cmStateEnums::MODULE_LIBRARY &&
      (this->GetPolicyStatusCMP0073() == cmPolicies::OLD ||
       this->GetPolicyStatusCMP0073() == cmPolicies::WARN)) {
    std::string targetEntry = cmStrCat(this->impl->Name, "_LIB_DEPENDS");
    std::string dependencies;
    cmValue old_val = mf.GetDefinition(targetEntry);
    if (old_val) {
      dependencies += *old_val;
    }
    switch (llt) {
      case GENERAL_LibraryType:
        dependencies += "general";
        break;
      case DEBUG_LibraryType:
        dependencies += "debug";
        break;
      case OPTIMIZED_LibraryType:
        dependencies += "optimized";
        break;
    }
    dependencies += ";";
    dependencies += lib;
    dependencies += ";";
    mf.AddCacheDefinition(targetEntry, dependencies,
                          "Dependencies for the target", cmStateEnums::STATIC);
  }
}